

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap2.c
# Opt level: O2

void Cffgsfd(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
            double *array,int *flagval,int *anynul,int *status)

{
  char *flagval_00;
  ulong uVar1;
  ulong uVar2;
  long size;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < naxis) {
    uVar2 = (ulong)(uint)naxis;
  }
  size = 1;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    size = size * ((trc[uVar1] - blc[uVar1]) / inc[uVar1] + 1);
  }
  flagval_00 = F2CcopyLogVect(size,flagval);
  ffgsfd(fptr,colnum,naxis,naxes,blc,trc,inc,array,flagval_00,anynul,status);
  C2FcopyLogVect(size,flagval,flagval_00);
  return;
}

Assistant:

void Cffgsfd( fitsfile *fptr, int colnum, int naxis, long *naxes, long *blc, long *trc, long *inc, double *array, int *flagval, int *anynul, int *status )
{
   char *Cflagval;
   long nflagval;
   int i;
 
   for( nflagval=1, i=0; i<naxis; i++ )
      nflagval *= (trc[i]-blc[i])/inc[i]+1;
   Cflagval = F2CcopyLogVect(nflagval, flagval );
   ffgsfd( fptr, colnum, naxis, naxes, blc, trc, inc, array, Cflagval, anynul, status );   
   C2FcopyLogVect(nflagval, flagval, Cflagval);
}